

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FileDescriptor * __thiscall
google::protobuf::DescriptorPool::NewPlaceholderFile(DescriptorPool *this,string *name)

{
  FileDescriptor *this_00;
  Mutex *in_RDI;
  MutexLockMaybe lock;
  MutexLockMaybe *in_stack_ffffffffffffffd0;
  string *in_stack_ffffffffffffffd8;
  DescriptorPool *in_stack_ffffffffffffffe0;
  
  internal::MutexLockMaybe::MutexLockMaybe(in_stack_ffffffffffffffd0,in_RDI);
  this_00 = NewPlaceholderFileWithMutexHeld(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  internal::MutexLockMaybe::~MutexLockMaybe((MutexLockMaybe *)this_00);
  return this_00;
}

Assistant:

FileDescriptor* DescriptorPool::NewPlaceholderFile(
    const std::string& name) const {
  MutexLockMaybe lock(mutex_);
  return NewPlaceholderFileWithMutexHeld(name);
}